

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumDescriptor * __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateArray<google::protobuf::EnumDescriptor>
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,int array_size)

{
  PointerT<char> pcVar1;
  int v1;
  Nullable<const_char_*> failure_msg;
  int iVar2;
  LogMessageFatal local_20;
  
  pcVar1 = (this->pointers_).payload_.super_Base<char>.value;
  if (pcVar1 == (PointerT<char>)0x0) {
    failure_msg = "has_allocated()";
    iVar2 = 0x1b0;
  }
  else {
    iVar2 = (this->used_).payload_.super_Base<char>.value;
    v1 = array_size * 0x58 + iVar2;
    (this->used_).payload_.super_Base<char>.value = v1;
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (v1,(this->total_).payload_.super_Base<char>.value,
                             "used <= total_.template Get<TypeToUse>()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return (EnumDescriptor *)(pcVar1 + iVar2);
    }
    iVar2 = 0x1b6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,iVar2,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }